

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SpanTest_CtorFromVector_Test::TestBody(SpanTest_CtorFromVector_Test *this)

{
  initializer_list<int> __l;
  int *piVar1;
  int *piVar2;
  size_t in_R8;
  Span<const_int> s_00;
  Span<int> s_01;
  undefined1 auStack_78 [8];
  Span<int> s;
  int *local_60;
  allocator<int> local_41;
  int local_40 [2];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> v;
  SpanTest_CtorFromVector_Test *this_local;
  
  local_40[0] = 1;
  local_40[1] = 2;
  local_38 = local_40;
  local_30 = 2;
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  Span<int_const>::
  Span<std::vector<int,std::allocator<int>>,void,std::vector<int,std::allocator<int>>>
            ((Span<int_const> *)&s.size_,(vector<int,_std::allocator<int>_> *)local_28);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  piVar2 = (int *)std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_28);
  s_00.size_ = (size_t)piVar1;
  s_00.data_ = local_60;
  TestConstCtor((anon_unknown_0 *)s.size_,s_00,piVar2,in_R8);
  Span<int>::Span<std::vector<int,std::allocator<int>>,void,std::vector<int,std::allocator<int>>>
            ((Span<int> *)auStack_78,(vector<int,_std::allocator<int>_> *)local_28);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_28);
  piVar2 = (int *)std::vector<int,_std::allocator<int>_>::size
                            ((vector<int,_std::allocator<int>_> *)local_28);
  s_01.size_ = (size_t)piVar1;
  s_01.data_ = s.data_;
  TestCtor((anon_unknown_0 *)auStack_78,s_01,piVar2,in_R8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST(SpanTest, CtorFromVector) {
  std::vector<int> v = {1, 2};
  // Const ctor is implicit.
  TestConstCtor(v, v.data(), v.size());
  // Mutable is explicit.
  Span<int> s(v);
  TestCtor(s, v.data(), v.size());
}